

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.h
# Opt level: O0

void __thiscall
agge::layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
          (layout *this,annotated_string<char,_agge::font_style_annotation> *text,
          undefined8 *param_3)

{
  float fVar1;
  uint uVar2;
  bool bVar3;
  size_t sVar4;
  range *prVar5;
  font_style_annotation *pfVar6;
  element_type *this_00;
  byte *pbVar7;
  difference_type dVar8;
  glyph *pgVar9;
  pointer ptVar10;
  box<float> bVar11;
  __normal_iterator<agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
  local_1b8;
  __normal_iterator<agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
  local_1b0;
  __normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
  local_1a8;
  const_iterator i_1;
  glyph *g;
  const_iterator next;
  const_iterator end;
  const_iterator i;
  undefined1 local_150 [8];
  ptr font_;
  const_iterator ranges_end;
  const_iterator range;
  layout_builder builder;
  font_factory *font_factory__local;
  richtext_t *text_local;
  layout *this_local;
  glyph *local_68;
  glyph *g_1;
  element_type *local_58;
  glyph *local_50;
  char *local_48;
  uint local_3c;
  long lStack_38;
  codepoint continuation;
  ptrdiff_t remainder;
  uint local_24;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Stack_20;
  codepoint c;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  uint local_c;
  
  sVar4 = annotated_string<char,_agge::font_style_annotation>::size(text);
  pod_vector<agge::positioned_glyph>::resize(&this->_glyphs,(count_t)sVar4);
  bVar11 = zero::operator_cast_to_box((zero *)((long)&builder._text_lines + 7));
  (this->_box).w = bVar11.w;
  (this->_box).h = bVar11.h;
  layout_builder::layout_builder
            ((layout_builder *)&range._annotations_end,&this->_glyphs,&this->_glyph_runs,
             &this->_text_lines);
  annotated_string<char,_agge::font_style_annotation>::ranges_begin
            ((const_iterator *)&ranges_end._annotations_end,text);
  annotated_string<char,_agge::font_style_annotation>::ranges_end
            ((const_iterator *)
             &font_.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount,text);
  do {
    bVar3 = annotated_string<char,_agge::font_style_annotation>::const_iterator::operator!=
                      ((const_iterator *)&ranges_end._annotations_end,
                       (const_iterator *)
                       &font_.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                      );
    if (!bVar3) {
      layout_builder::break_current_line((layout_builder *)&range._annotations_end);
      std::vector<agge::text_line,_std::allocator<agge::text_line>_>::pop_back(&this->_text_lines);
      local_1b0._M_current =
           (text_line *)
           std::vector<agge::text_line,_std::allocator<agge::text_line>_>::begin(&this->_text_lines)
      ;
      __gnu_cxx::
      __normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>
      ::__normal_iterator<agge::text_line*>
                ((__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>
                  *)&local_1a8,&local_1b0);
      while( true ) {
        local_1b8._M_current =
             (text_line *)
             std::vector<agge::text_line,_std::allocator<agge::text_line>_>::end(&this->_text_lines)
        ;
        bVar3 = __gnu_cxx::operator!=(&local_1a8,&local_1b8);
        if (!bVar3) break;
        ptVar10 = __gnu_cxx::
                  __normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
                  ::operator->(&local_1a8);
        if ((this->_box).w <= ptVar10->extent && ptVar10->extent != (this->_box).w) {
          ptVar10 = __gnu_cxx::
                    __normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
                    ::operator->(&local_1a8);
          (this->_box).w = ptVar10->extent;
        }
        ptVar10 = __gnu_cxx::
                  __normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
                  ::operator->(&local_1a8);
        fVar1 = (ptVar10->offset).dy;
        ptVar10 = __gnu_cxx::
                  __normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
                  ::operator->(&local_1a8);
        (this->_box).h = fVar1 + ptVar10->descent;
        __gnu_cxx::
        __normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
        ::operator++(&local_1a8);
      }
      return;
    }
    prVar5 = annotated_string<char,_agge::font_style_annotation>::const_iterator::operator->
                       ((const_iterator *)&ranges_end._annotations_end);
    pfVar6 = annotated_string<char,_agge::font_style_annotation>::range::get_annotation(prVar5);
    (**(code **)*param_3)((shared_ptr<agge::font> *)local_150,param_3,pfVar6);
    layout_builder::begin_style
              ((layout_builder *)&range._annotations_end,(shared_ptr<agge::font> *)local_150);
    limit::base::begin_style<agge::layout_builder>
              ((base *)((long)&this_local + 7),(layout_builder *)&range._annotations_end);
    prVar5 = annotated_string<char,_agge::font_style_annotation>::const_iterator::operator->
                       ((const_iterator *)&ranges_end._annotations_end);
    end = range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::begin(&prVar5->
                   super_range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 );
    prVar5 = annotated_string<char,_agge::font_style_annotation>::const_iterator::operator->
                       ((const_iterator *)&ranges_end._annotations_end);
    next = range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::end(&prVar5->
                  super_range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                );
    do {
      while( true ) {
        bVar3 = __gnu_cxx::operator!=(&end,&next);
        if (!bVar3) {
          i_1._M_current._4_4_ = 0;
          goto LAB_00246470;
        }
        bVar3 = eat_lf<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(&end);
        if (!bVar3) break;
        layout_builder::break_current_line((layout_builder *)&range._annotations_end);
        limit::base::new_line((base *)((long)&this_local + 7));
      }
      g = (glyph *)end._M_current;
      this_00 = std::__shared_ptr_access<agge::font,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<agge::font,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_150);
      local_18._M_current = next._M_current;
      p_Stack_20 = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&g;
      remainder = (ptrdiff_t)
                  __gnu_cxx::
                  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator++(p_Stack_20,0);
      pbVar7 = (byte *)__gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&remainder);
      local_24 = (uint)*pbVar7;
      uVar2 = local_24;
      if (0x7f < local_24) {
        if (local_24 < 0xc0) {
          local_c = 0xfffd;
          uVar2 = local_c;
        }
        else {
          if (local_24 < 0xe0) {
            lStack_38 = 1;
            local_24 = local_24 & 0x1f;
          }
          else if (local_24 < 0xf0) {
            lStack_38 = 2;
            local_24 = local_24 & 0xf;
          }
          else {
            if (0xf7 < local_24) {
              local_c = 0xfffd;
              uVar2 = local_c;
              goto LAB_0024634f;
            }
            lStack_38 = 3;
            local_24 = local_24 & 7;
          }
          dVar8 = __gnu_cxx::operator-(&local_18,p_Stack_20);
          if (dVar8 < lStack_38) {
            p_Stack_20->_M_current = local_18._M_current;
            local_c = 0xfffd;
            uVar2 = local_c;
          }
          else {
            do {
              pbVar7 = (byte *)__gnu_cxx::
                               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ::operator*(p_Stack_20);
              local_3c = (uint)*pbVar7;
              if ((local_3c & 0xc0) != 0x80) {
                local_c = 0xfffd;
                uVar2 = local_c;
                goto LAB_0024634f;
              }
              local_24 = (local_3c & 0x3f) + local_24 * 0x40;
              local_48 = (char *)__gnu_cxx::
                                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ::operator++(p_Stack_20,0);
              lStack_38 = lStack_38 + -1;
            } while (lStack_38 != 0);
            local_c = local_24;
            uVar2 = local_c;
          }
        }
      }
LAB_0024634f:
      local_c = uVar2;
      g_1._4_4_ = local_c;
      local_58 = this_00;
      if ((0x7f < local_c) ||
         (local_68 = this_00->_ansi_glyphs[local_c], pgVar9 = local_68, local_68 == (glyph *)0x0)) {
        pgVar9 = font::get_glyph_for_codepoint_slow(this_00,local_c);
      }
      local_50 = pgVar9;
      bVar3 = limit::base::
              add_glyph<agge::layout_builder,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        ((base *)((long)&this_local + 7),(layout_builder *)&range._annotations_end,
                         local_50->index,(local_50->metrics).advance_x,&end,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )g,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )next._M_current);
    } while (bVar3);
    std::vector<agge::text_line,_std::allocator<agge::text_line>_>::clear(&this->_text_lines);
    i_1._M_current._4_4_ = 1;
LAB_00246470:
    std::shared_ptr<agge::font>::~shared_ptr((shared_ptr<agge::font> *)local_150);
    if (i_1._M_current._4_4_ != 0) {
      return;
    }
    annotated_string<char,_agge::font_style_annotation>::const_iterator::operator++
              ((const_iterator *)&ranges_end._annotations_end);
  } while( true );
}

Assistant:

inline void layout::process(const richtext_t &text, LimiterT limiter, FontFactoryT &font_factory_)
	{
		_glyphs.resize(static_cast<count_t>(text.size()));
		_box = zero();

		layout_builder builder(_glyphs, _glyph_runs, _text_lines);

		for (richtext_t::const_iterator range = text.ranges_begin(), ranges_end = text.ranges_end(); range != ranges_end;
			++range)
		{
			const font::ptr font_ = font_factory_.create_font(range->get_annotation().basic);

			builder.begin_style(font_);
			limiter.begin_style(static_cast<const layout_builder &>(builder));
			for (std::string::const_iterator i = range->begin(), end = range->end(); i != end; )
			{
				if (eat_lf(i))
				{
					builder.break_current_line();
					limiter.new_line();
					continue;
				}

				std::string::const_iterator next = i;
				const glyph &g = *font_->get_glyph_for_codepoint(utfia::utf8::next(next, end));

				if (!limiter.add_glyph(builder, g.index, g.metrics.advance_x, i, next, end))
				{
					_text_lines.clear();
					return;
				}
			}
		}
		builder.break_current_line();
		_text_lines.pop_back();
		for (text_lines_container_t::const_iterator i = _text_lines.begin(); i != _text_lines.end(); ++i)
		{
			if (i->extent > _box.w)
				_box.w = i->extent;
			_box.h = i->offset.dy + i->descent;
		}
	}